

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O3

bool __thiscall Controller::landPerson(Controller *this,Person *p,Container *currentContainer)

{
  Boat *this_00;
  bool bVar1;
  ostream *poVar2;
  Container *to;
  string local_38;
  
  this_00 = this->boat;
  if (this_00 != (Boat *)currentContainer) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"La personne ",0xc);
    Person::getName_abi_cxx11_(&local_38,p);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_38._M_dataplus._M_p,local_38._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," n\'est pas sur le bateau",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    return false;
  }
  to = &Boat::getBank(this_00)->super_Container;
  bVar1 = tryMovePerson(this,&this_00->super_Container,to,p);
  return bVar1;
}

Assistant:

bool Controller::landPerson(Person* p, Container* currentContainer) {
    // Checks if the person is on the boat
    if (currentContainer != boat) {
        cout << "La personne " << p->getName() <<
        " n'est pas sur le bateau" << endl;
        return false;
    }

    // Tries to make the move
    return tryMovePerson(boat, boat->getBank(), p);
}